

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instdb.cpp
# Opt level: O2

InstId asmjit::v1_14::InstNameUtils::find
                 (char *s,size_t len,InstNameIndex *nameIndex,uint32_t *nameTable,char *stringTable)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  char nameData [32];
  
  lVar10 = 0;
  if (s != (char *)0x0) {
    if (len == 0xffffffffffffffff) {
      len = strlen(s);
    }
    if ((len - 1 < (ulong)nameIndex->maxNameLength) && (uVar3 = (int)*s - 0x61, uVar3 < 0x1a)) {
      uVar9 = (ulong)nameIndex->data[uVar3].start;
      lVar10 = 0;
      if (uVar9 != 0) {
        uVar6 = nameIndex->data[uVar3].end - uVar9;
        while (uVar11 = uVar6, uVar11 != 0) {
          lVar10 = (uVar11 >> 1) + uVar9;
          sVar4 = decodeToBuffer(nameData,nameTable[lVar10],stringTable);
          sVar5 = sVar4;
          if (len <= sVar4) {
            sVar5 = len;
          }
          uVar6 = 0xffffffffffffffff;
          do {
            if (uVar6 - sVar5 == -1) {
              iVar7 = -1;
              uVar6 = sVar5;
              break;
            }
            lVar1 = uVar6 + 1;
            lVar2 = uVar6 + 1;
            uVar6 = uVar6 + 1;
            iVar7 = (uint)(byte)s[lVar1] - (uint)(byte)nameData[lVar2];
          } while (iVar7 == 0);
          iVar8 = (int)len - (int)sVar4;
          if (uVar6 < sVar5) {
            iVar8 = iVar7;
          }
          uVar6 = uVar11 >> 1;
          if (-1 < iVar8) {
            if (iVar8 == 0) goto LAB_0011abbb;
            uVar9 = lVar10 + 1;
            uVar6 = uVar11 - 1 >> 1;
          }
        }
        lVar10 = 0;
      }
    }
  }
LAB_0011abbb:
  return (InstId)lVar10;
}

Assistant:

InstId find(const char* s, size_t len, const InstNameIndex& nameIndex, const uint32_t* nameTable, const char* stringTable) noexcept {
  if (ASMJIT_UNLIKELY(!s))
    return BaseInst::kIdNone;

  if (len == SIZE_MAX)
    len = strlen(s);

  if (ASMJIT_UNLIKELY(len == 0 || len > nameIndex.maxNameLength))
    return BaseInst::kIdNone;

  uint32_t prefix = uint32_t(s[0]) - 'a';
  if (ASMJIT_UNLIKELY(prefix > 'z' - 'a'))
    return BaseInst::kIdNone;

  size_t base = nameIndex.data[prefix].start;
  size_t end = nameIndex.data[prefix].end;

  if (ASMJIT_UNLIKELY(!base))
    return BaseInst::kIdNone;

  char nameData[kBufferSize];
  for (size_t lim = end - base; lim != 0; lim >>= 1) {
    size_t instId = base + (lim >> 1);
    size_t nameSize = decodeToBuffer(nameData, nameTable[instId], stringTable);

    int result = Support::compareStringViews(s, len, nameData, nameSize);
    if (result < 0)
      continue;

    if (result > 0) {
      base = instId + 1;
      lim--;
      continue;
    }

    return InstId(instId);
  }

  return BaseInst::kIdNone;
}